

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_match.h
# Opt level: O0

bool booster::regex_match<booster::regex>(char *begin,char *end,cmatch *m,regex *r,int flags)

{
  byte bVar1;
  char *in_RCX;
  vector *in_RSI;
  char *in_RDI;
  bool res;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> map;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *in_stack_ffffffffffffff88;
  char *end_00;
  undefined7 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  char local_48 [32];
  char *local_28;
  vector *local_18;
  char *local_10;
  byte local_1;
  
  end_00 = local_48;
  local_28 = in_RCX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x113acc);
  bVar1 = booster::regex::match(local_28,local_10,local_18,(int)end_00);
  local_1 = (bVar1 & 1) != 0;
  if ((bool)local_1) {
    match_results<const_char_*>::assign
              ((match_results<const_char_*> *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               (char *)CONCAT17(bVar1,in_stack_ffffffffffffff98),end_00,in_stack_ffffffffffffff88);
  }
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
             CONCAT44(in_stack_ffffffffffffffa4,1));
  return (bool)(local_1 & 1);
}

Assistant:

bool regex_match(char const *begin,char const *end,cmatch &m, Regex const &r,int flags = 0)
	{
		std::vector<std::pair<int,int> > map;
		bool res = r.match(begin,end,map,flags);
		if(!res) return false;
		m.assign(begin,end,map);
		return true;
	}